

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>
* __thiscall
kj::
coCapture<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>
          (CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>
           *__return_storage_ptr__,kj *this,Type *f)

{
  Type *f_00;
  Type *f_local;
  
  f_00 = mv<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>
                   ((Type *)this);
  _::
  CaptureForCoroutine<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:544:10)>
  ::CaptureForCoroutine(__return_storage_ptr__,f_00);
  return __return_storage_ptr__;
}

Assistant:

auto coCapture(Functor&& f) {
  // Assuming `f()` returns a Promise<T> `p`, wrap `f` in such a way that it will outlive its
  // returned Promise. Note that the returned object may only be invoked once.
  //
  // This function is meant to help address this pain point with functors that return a coroutine:
  // https://isocpp.github.io/CppCoreGuidelines/CppCoreGuidelines#Rcoro-capture
  //
  // The two most common patterns where this may be useful look like so:
  // ```
  // void addTask(Value myValue) {
  //   auto myFun = [myValue]() -> kj::Promise<void> {
  //     ...
  //     co_return;
  //   };
  //   tasks.add(myFun());
  // }
  // ```
  // and
  // ```
  // kj::Promise<void> afterPromise(kj::Promise<void> promise, Value myValue) {
  //   auto myFun = [myValue]() -> kj::Promise<void> {
  //     ...
  //     co_return;
  //   };
  //   return promise.then(kj::mv(myFun));
  // }
  // ```
  //
  // Note that there are potentially more optimal alternatives to both of these patterns:
  // ```
  // void addTask(Value myValue) {
  //   auto myFun = [](auto myValue) -> kj::Promise<void> {
  //     ...
  //     co_return;
  //   };
  //   tasks.add(myFun(myValue));
  // }
  // ```
  // and
  // ```
  // kj::Promise<void> afterPromise(kj::Promise<void> promise, Value myValue) {
  //   auto myFun = [&]() -> kj::Promise<void> {
  //     ...
  //     co_return;
  //   };
  //   co_await promise;
  //   co_await myFun();
  //   co_return;
  // }
  // ```
  //
  // For situations where you are trying to capture a specific local variable, kj::mvCapture() can
  // also be useful:
  // ```
  // kj::Promise<void> reactToPromise(kj::Promise<MyType> promise) {
  //   BigA a;
  //   TinyB b;
  //
  //   doSomething(a, b);
  //   return promise.then(kj::mvCapture(b, [](TinyB b, MyType type) -> kj::Promise<void> {
  //     ...
  //     co_return;
  //   });
  // }
  // ```

  return _::CaptureForCoroutine(kj::mv(f));
}